

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QTextCharFormat> * __thiscall
QList<QTextCharFormat>::fill(QList<QTextCharFormat> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  qsizetype qVar2;
  QTextCharFormat *pQVar3;
  QTextFormat *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QTextFormatPrivate *local_50;
  QArrayDataPointer<QTextCharFormat> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (pDVar1 == (Data *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (pDVar1->super_QArrayData).alloc;
    }
    if (newSize <= lVar5) {
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)&local_48,&t->super_QTextFormat);
      lVar5 = (this->d).size;
      if (newSize <= lVar5) {
        lVar5 = newSize;
      }
      if (lVar5 != 0) {
        lVar5 = lVar5 << 4;
        pQVar4 = &((this->d).ptr)->super_QTextFormat;
        do {
          QTextFormat::operator=(pQVar4,&t->super_QTextFormat);
          lVar5 = lVar5 + -0x10;
          pQVar4 = pQVar4 + 1;
        } while (lVar5 != 0);
      }
      lVar5 = (this->d).size;
      if (newSize - lVar5 == 0 || newSize < lVar5) {
        if (newSize < lVar5) {
          pQVar4 = &(this->d).ptr[newSize].super_QTextFormat;
          lVar5 = lVar5 * 0x10 + newSize * -0x10;
          do {
            QTextFormat::~QTextFormat(pQVar4);
            pQVar4 = pQVar4 + 1;
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
          (this->d).size = newSize;
        }
      }
      else {
        QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
                  ((QGenericArrayOps<QTextCharFormat> *)this,newSize - lVar5,
                   (parameter_type)&local_48);
      }
      QTextFormat::~QTextFormat((QTextFormat *)&local_48);
      goto LAB_004c2457;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
  lVar5 = newSize;
  if (pDVar1 != (Data *)0x0) {
    lVar5 = (pDVar1->super_QArrayData).alloc;
    if (lVar5 <= newSize) {
      lVar5 = newSize;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar5 = newSize;
    }
  }
  local_50 = (QTextFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QTextCharFormat *)
           QArrayData::allocate((QArrayData **)&local_50,0x10,0x10,lVar5,KeepSize);
  local_48.size = 0;
  local_48.ptr = pQVar3;
  local_48.d = (Data *)local_50;
  for (; newSize != 0; newSize = newSize + -1) {
    QTextFormat::QTextFormat(&pQVar3[local_48.size].super_QTextFormat,&t->super_QTextFormat);
    local_48.size = local_48.size + 1;
  }
  pDVar1 = (this->d).d;
  pQVar3 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  qVar2 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.d = pDVar1;
  local_48.ptr = pQVar3;
  local_48.size = qVar2;
  QArrayDataPointer<QTextCharFormat>::~QArrayDataPointer(&local_48);
LAB_004c2457:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}